

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_string.c
# Opt level: O3

void ngx_unescape_uri(u_char **dst,u_char **src,size_t size,ngx_uint_t type)

{
  byte bVar1;
  byte *pbVar2;
  byte *pbVar3;
  byte bVar4;
  byte bVar5;
  int iVar6;
  char cVar7;
  byte *pbVar8;
  
  pbVar3 = *dst;
  pbVar8 = *src;
  if (size != 0) {
    iVar6 = 0;
    pbVar2 = pbVar8;
    bVar5 = 0;
    do {
      pbVar8 = pbVar2 + 1;
      bVar1 = *pbVar2;
      bVar4 = bVar5;
      if (iVar6 == 2) {
        if ((byte)(bVar1 - 0x30) < 10) {
          cVar7 = bVar1 + bVar5 * '\x10';
          if (((type & 2) == 0) || ((byte)(cVar7 + 0xaaU) < 0x59)) {
            *pbVar3 = cVar7 - 0x30;
LAB_0011813c:
            pbVar3 = pbVar3 + 1;
          }
          else {
            *pbVar3 = 0x25;
            pbVar3[1] = pbVar2[-1];
            pbVar3[2] = *pbVar2;
            pbVar3 = pbVar3 + 3;
          }
          iVar6 = 0;
          bVar4 = bVar5;
        }
        else {
          iVar6 = 0;
          if ((byte)((bVar1 | 0x20) + 0x9f) < 6) {
            cVar7 = (bVar1 | 0x20) + bVar5 * '\x10';
            bVar5 = cVar7 + 0xa9;
            if ((type & 1) == 0) {
              if ((type & 2) != 0) {
                if (bVar5 == 0x3f) goto LAB_001181cb;
                if (0x58 < (byte)(cVar7 + 0x83U)) {
                  *pbVar3 = 0x25;
                  pbVar3[1] = pbVar2[-1];
                  pbVar3[2] = *pbVar2;
                  pbVar3 = pbVar3 + 3;
                  goto LAB_00118142;
                }
              }
            }
            else if (bVar5 == 0x3f) {
LAB_001181cb:
              *pbVar3 = 0x3f;
              pbVar3 = pbVar3 + 1;
              break;
            }
            *pbVar3 = bVar5;
            pbVar3 = pbVar3 + 1;
            iVar6 = 0;
          }
        }
      }
      else if (iVar6 == 1) {
        bVar4 = bVar1 - 0x30;
        iVar6 = 2;
        if (9 < bVar4) {
          if (5 < (byte)((bVar1 | 0x20) + 0x9f)) {
LAB_00118139:
            *pbVar3 = bVar1;
            goto LAB_0011813c;
          }
          bVar4 = (bVar1 | 0x20) + 0xa9;
        }
      }
      else {
        if (((type & 3) != 0) && (bVar1 == 0x3f)) goto LAB_001181cb;
        iVar6 = 1;
        if (bVar1 != 0x25) goto LAB_00118139;
      }
LAB_00118142:
      size = size - 1;
      pbVar2 = pbVar8;
      bVar5 = bVar4;
    } while (size != 0);
  }
  *dst = pbVar3;
  *src = pbVar8;
  return;
}

Assistant:

void
ngx_unescape_uri(u_char **dst, u_char **src, size_t size, ngx_uint_t type)
{
    u_char  *d, *s, ch, c, decoded;
    enum {
        sw_usual = 0,
        sw_quoted,
        sw_quoted_second
    } state;

    d = *dst;
    s = *src;

    state = 0;
    decoded = 0;

    while (size--) {

        ch = *s++;

        switch (state) {
        case sw_usual:
            if (ch == '?'
                && (type & (NGX_UNESCAPE_URI|NGX_UNESCAPE_REDIRECT)))
            {
                *d++ = ch;
                goto done;
            }

            if (ch == '%') {
                state = sw_quoted;
                break;
            }

            *d++ = ch;
            break;

        case sw_quoted:

            if (ch >= '0' && ch <= '9') {
                decoded = (u_char) (ch - '0');
                state = sw_quoted_second;
                break;
            }

            c = (u_char) (ch | 0x20);
            if (c >= 'a' && c <= 'f') {
                decoded = (u_char) (c - 'a' + 10);
                state = sw_quoted_second;
                break;
            }

            /* the invalid quoted character */

            state = sw_usual;

            *d++ = ch;

            break;

        case sw_quoted_second:

            state = sw_usual;

            if (ch >= '0' && ch <= '9') {
                ch = (u_char) ((decoded << 4) + ch - '0');

                if (type & NGX_UNESCAPE_REDIRECT) {
                    if (ch > '%' && ch < 0x7f) {
                        *d++ = ch;
                        break;
                    }

                    *d++ = '%'; *d++ = *(s - 2); *d++ = *(s - 1);

                    break;
                }

                *d++ = ch;

                break;
            }

            c = (u_char) (ch | 0x20);
            if (c >= 'a' && c <= 'f') {
                ch = (u_char) ((decoded << 4) + c - 'a' + 10);

                if (type & NGX_UNESCAPE_URI) {
                    if (ch == '?') {
                        *d++ = ch;
                        goto done;
                    }

                    *d++ = ch;
                    break;
                }

                if (type & NGX_UNESCAPE_REDIRECT) {
                    if (ch == '?') {
                        *d++ = ch;
                        goto done;
                    }

                    if (ch > '%' && ch < 0x7f) {
                        *d++ = ch;
                        break;
                    }

                    *d++ = '%'; *d++ = *(s - 2); *d++ = *(s - 1);
                    break;
                }

                *d++ = ch;

                break;
            }

            /* the invalid quoted character */

            break;
        }
    }

done:

    *dst = d;
    *src = s;
}